

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parentedentity.cpp
# Opt level: O3

void __thiscall
libcellml::ParentedEntity::ParentedEntityImpl::removeParent(ParentedEntityImpl *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  __weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_18._M_ptr = (element_type *)0x0;
  local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->mParent).
              super___weak_ptr<libcellml::ParentedEntity,_(__gnu_cxx::_Lock_policy)2>,&local_18);
  if (local_18._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_18._M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_18._M_refcount._M_pi)->_M_weak_count;
      (local_18._M_refcount._M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_18._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

void ParentedEntity::ParentedEntityImpl::removeParent()
{
    mParent = {};
}